

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectStore.cpp
# Opt level: O1

ObjectStoreToken * __thiscall ObjectStore::newToken(ObjectStore *this,ByteString *label)

{
  uchar *puVar1;
  pointer *pppOVar2;
  _Vector_impl_data *p_Var3;
  pointer pcVar4;
  iterator iVar5;
  undefined8 *puVar6;
  ObjectStoreToken *pOVar7;
  _func_int **pp_Var8;
  ObjectStoreToken OVar9;
  ObjectStoreToken *newToken;
  string serialNumber;
  ByteString serial;
  string tokenUUID;
  MutexLocker lock;
  ObjectStoreToken *local_f8;
  long local_f0;
  ObjectStoreToken local_e8 [2];
  uchar *local_d8;
  size_t local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ByteString local_b8;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  MutexLocker local_70;
  string local_60;
  string local_40;
  
  MutexLocker::MutexLocker(&local_70,this->storeMutex);
  UUID::newUUID_abi_cxx11_();
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_90);
  std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_90);
  p_Var3 = &local_b8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data;
  pp_Var8 = (_func_int **)0xf;
  if ((_Vector_impl_data *)local_b8._vptr_ByteString != p_Var3) {
    pp_Var8 = (_func_int **)
              local_b8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pp_Var8 < local_f0 +
                local_b8.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                super__Tp_alloc_type._vptr_SecureAllocator) {
    OVar9._vptr_ObjectStoreToken = (_func_int **)0xf;
    if (local_f8 != local_e8) {
      OVar9._vptr_ObjectStoreToken = local_e8[0]._vptr_ObjectStoreToken;
    }
    if (local_f0 +
        local_b8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
        _M_impl.super__Tp_alloc_type._vptr_SecureAllocator <= OVar9._vptr_ObjectStoreToken) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_f8,0,(char *)0x0,(ulong)local_b8._vptr_ByteString);
      goto LAB_00169a77;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_f8);
LAB_00169a77:
  local_d8 = (uchar *)&local_c8;
  puVar1 = (uchar *)(puVar6 + 2);
  if ((uchar *)*puVar6 == puVar1) {
    local_c8 = *(undefined8 *)puVar1;
    uStack_c0 = puVar6[3];
  }
  else {
    local_c8 = *(undefined8 *)puVar1;
    local_d8 = (uchar *)*puVar6;
  }
  local_d0 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *puVar1 = '\0';
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if ((_Vector_impl_data *)local_b8._vptr_ByteString != p_Var3) {
    operator_delete(local_b8._vptr_ByteString);
  }
  ByteString::ByteString(&local_b8,local_d8,local_d0);
  pcVar4 = (this->storePath)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar4,pcVar4 + (this->storePath)._M_string_length);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_90,local_90 + local_88);
  pOVar7 = ObjectStoreToken::createToken(&local_40,&local_60,this->umask,label,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_f8 = pOVar7;
  if (pOVar7 != (ObjectStoreToken *)0x0) {
    iVar5._M_current =
         (this->tokens).super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->tokens).super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ObjectStoreToken*,std::allocator<ObjectStoreToken*>>::
      _M_realloc_insert<ObjectStoreToken*const&>
                ((vector<ObjectStoreToken*,std::allocator<ObjectStoreToken*>> *)&this->tokens,iVar5,
                 &local_f8);
    }
    else {
      *iVar5._M_current = pOVar7;
      pppOVar2 = &(this->tokens).
                  super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppOVar2 = *pppOVar2 + 1;
    }
    iVar5._M_current =
         (this->allTokens).
         super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->allTokens).
        super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ObjectStoreToken*,std::allocator<ObjectStoreToken*>>::
      _M_realloc_insert<ObjectStoreToken*const&>
                ((vector<ObjectStoreToken*,std::allocator<ObjectStoreToken*>> *)&this->allTokens,
                 iVar5,&local_f8);
    }
    else {
      *iVar5._M_current = local_f8;
      pppOVar2 = &(this->allTokens).
                  super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppOVar2 = *pppOVar2 + 1;
    }
  }
  pOVar7 = local_f8;
  local_b8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_b8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  if (local_d8 != (uchar *)&local_c8) {
    operator_delete(local_d8);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  MutexLocker::~MutexLocker(&local_70);
  return pOVar7;
}

Assistant:

ObjectStoreToken* ObjectStore::newToken(const ByteString& label)
{
	MutexLocker lock(storeMutex);

	// Generate a UUID for the token
	std::string tokenUUID = UUID::newUUID();

	// Convert the UUID to a serial number
	std::string serialNumber = tokenUUID.substr(19, 4) + tokenUUID.substr(24);
	ByteString serial((const unsigned char*) serialNumber.c_str(), serialNumber.size());

	// Create the token
	ObjectStoreToken* newToken = ObjectStoreToken::createToken(storePath, tokenUUID, umask, label, serial);

	if (newToken != NULL)
	{
		tokens.push_back(newToken);
		allTokens.push_back(newToken);
	}

	return newToken;
}